

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

reference<mpt::layout::line> * __thiscall
mpt::reference<mpt::layout::line>::operator=
          (reference<mpt::layout::line> *this,reference<mpt::layout::line> *ref)

{
  int iVar1;
  undefined4 extraout_var;
  line *plVar2;
  line *plVar3;
  
  plVar3 = ref->_ref;
  plVar2 = this->_ref;
  if (plVar3 != plVar2) {
    if (plVar3 == (line *)0x0) {
      plVar3 = (line *)0x0;
    }
    else {
      iVar1 = (*(plVar3->super_metatype).super_convertable._vptr_convertable[2])(plVar3);
      if (CONCAT44(extraout_var,iVar1) == 0) {
        plVar3 = (line *)0x0;
      }
      plVar2 = this->_ref;
    }
    if (plVar2 != (line *)0x0) {
      (*(plVar2->super_metatype).super_convertable._vptr_convertable[1])();
    }
    this->_ref = plVar3;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}